

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O3

int Mpm_CutComputeDsd6(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                      Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  word wVar11;
  word wVar12;
  word *pwVar13;
  word *pwVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint local_48 [6];
  
  local_48[0] = 0xffffffff;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_48[5] = 0xffffffff;
  uVar5 = *(uint *)&pCut0->field_0x4;
  uVar16 = uVar5 >> 1 & 0xffffff;
  uVar9 = *(uint *)&pCut1->field_0x4;
  uVar4 = uVar9 >> 1 & 0xffffff;
  if (pCutC == (Mpm_Cut_t *)0x0) {
    uVar1 = p->uPermMask[1];
    if (((long)(int)uVar1 < 0) || (p->vMap2Perm->nSize <= (int)uVar1)) goto LAB_00891870;
    uVar4 = uVar4 * 0x2d0 + p->vMap2Perm->pArray[(int)uVar1];
    if (((int)uVar4 < 0) || (p->vPerm6->nSize <= (int)uVar4)) goto LAB_0089188f;
    wVar11 = p->vPerm6->pArray[uVar4];
    if (p->uComplMask[1] != 0) {
      pwVar14 = s_Truths6;
      lVar7 = 0;
      do {
        if ((p->uComplMask[1] >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          bVar8 = (byte)(1 << ((byte)lVar7 & 0x1f));
          wVar11 = (*pwVar14 & wVar11) >> (bVar8 & 0x3f) | wVar11 << (bVar8 & 0x3f) & *pwVar14;
        }
        lVar7 = lVar7 + 1;
        pwVar14 = pwVar14 + 1;
      } while (lVar7 != 6);
    }
    uVar17 = *(ulong *)((long)&p->pDsd6->uTruth + (ulong)(uVar16 << 5)) ^
             -(ulong)(((uVar5 >> 0x19 ^ uVar5) & 1) != fCompl0);
    uVar15 = -(ulong)(((uVar9 >> 0x19 ^ uVar9) & 1) != fCompl1) ^ wVar11;
    if (Type == 2) {
      wVar11 = uVar15 ^ uVar17;
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                      ,0x3bc,
                      "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      wVar11 = uVar15 & uVar17;
    }
  }
  else {
    uVar1 = p->uPermMask[1];
    if ((long)(int)uVar1 < 0) {
LAB_00891870:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = p->vMap2Perm->nSize;
    if ((int)uVar2 <= (int)uVar1) goto LAB_00891870;
    uVar10 = p->uPermMask[2];
    if (((long)(int)uVar10 < 0) || (uVar2 <= uVar10)) goto LAB_00891870;
    piVar3 = p->vMap2Perm->pArray;
    uVar4 = uVar4 * 0x2d0 + piVar3[(int)uVar1];
    if ((int)uVar4 < 0) {
LAB_0089188f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    uVar1 = p->vPerm6->nSize;
    if ((int)uVar1 <= (int)uVar4) goto LAB_0089188f;
    uVar2 = *(uint *)&pCutC->field_0x4;
    uVar10 = (uVar2 >> 1 & 0xffffff) * 0x2d0 + piVar3[(int)uVar10];
    if (((int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0089188f;
    pwVar14 = p->vPerm6->pArray;
    wVar11 = pwVar14[uVar4];
    if (p->uComplMask[1] != 0) {
      pwVar13 = s_Truths6;
      lVar7 = 0;
      do {
        if ((p->uComplMask[1] >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          bVar8 = (byte)(1 << ((byte)lVar7 & 0x1f));
          wVar11 = (*pwVar13 & wVar11) >> (bVar8 & 0x3f) | wVar11 << (bVar8 & 0x3f) & *pwVar13;
        }
        lVar7 = lVar7 + 1;
        pwVar13 = pwVar13 + 1;
      } while (lVar7 != 6);
    }
    wVar12 = pwVar14[uVar10];
    if (p->uComplMask[2] != 0) {
      pwVar14 = s_Truths6;
      lVar7 = 0;
      do {
        if ((p->uComplMask[2] >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          bVar8 = (byte)(1 << ((byte)lVar7 & 0x1f));
          wVar12 = (*pwVar14 & wVar12) >> (bVar8 & 0x3f) | wVar12 << (bVar8 & 0x3f) & *pwVar14;
        }
        lVar7 = lVar7 + 1;
        pwVar14 = pwVar14 + 1;
      } while (lVar7 != 6);
    }
    uVar17 = *(ulong *)((long)&p->pDsd6->uTruth + (ulong)(uVar16 << 5)) ^
             -(ulong)(((uVar5 >> 0x19 ^ uVar5) & 1) != fCompl0);
    wVar11 = (wVar11 ^ -(ulong)(((uVar9 >> 0x19 ^ uVar9) & 1) != fCompl1) ^ uVar17) &
             (-(ulong)((uVar2 >> 0x19 & 1 ^ fComplC) != (uVar2 & 1)) ^ wVar12) ^ uVar17;
  }
  uVar5 = Mpm_CutCheckDsd6(p,wVar11);
  if (uVar5 == 0xffffffff) {
    p->nNonDsd = p->nNonDsd + 1;
LAB_00891728:
    iVar6 = 0;
  }
  else {
    uVar9 = (int)uVar5 >> 0x11;
    if (p->pPars->fMap4Gates == 0) {
      if ((int)uVar9 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
    }
    else {
      if (((int)uVar9 < 0) || (p->vNpnConfigs->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (p->vNpnConfigs->pArray[uVar9].nSize == 0) {
        p->nNoMatch = p->nNoMatch + 1;
        goto LAB_00891728;
      }
    }
    uVar4 = uVar5 & 0xffff;
    uVar5 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar5 >> 0x10 & 1) + uVar9 * 2;
    *(uint *)&pCut->field_0x4 = uVar5;
    if (0xb3ff < uVar4) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                    ,0x405,
                    "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    if (0x7ffffff < uVar5) {
      uVar17 = 0;
      do {
        if (pCut->pLeaves[uVar17] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        local_48[p->Perm6[uVar4 >> 6][uVar17]] =
             pCut->pLeaves[uVar17] ^ (uint)((uVar4 >> ((uint)uVar17 & 0x1f) & 1) != 0);
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar5 >> 0x1b);
    }
    uVar4 = p->pDsd6[(int)uVar9].nVars;
    *(uint *)&pCut->field_0x4 = uVar5 & 0x7ffffff | uVar4 << 0x1b;
    uVar5 = uVar4 & 0x1f;
    if (uVar5 != 0) {
      uVar17 = 0;
      do {
        if (local_48[uVar17] == 0xffffffff) {
          __assert_fail("pLeavesNew[i] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                        ,0x40a,
                        "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                       );
        }
        uVar17 = uVar17 + 1;
      } while (uVar5 != uVar17);
      if (uVar5 != 0) {
        memcpy(pCut->pLeaves,local_48,(ulong)((uVar4 & 0x1f) << 2));
      }
    }
    p->nCountDsd[(int)uVar9] = p->nCountDsd[(int)uVar9] + 1;
    p->nSmallSupp = p->nSmallSupp + (uint)(*(uint *)&pCut->field_0x4 < 0x10000000);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int Mpm_CutComputeDsd6( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int fVerbose = 0;
    int i, Config, iClass, fCompl;
    int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
    word t = 0;
    if ( pCutC == NULL )
    {
        word t0, t1;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        if ( Type == 1 )
            t = t0 & t1;
        else if ( Type == 2 )
            t = t0 ^ t1;
        else assert( 0 );

if ( fVerbose )
{
Mpm_ManPrintPerm( p->uPermMask[1] );               printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
    }
    else
    {
        word t0, t1, tC;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        int iClassC  = Abc_Lit2Var(pCutC->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        int PermC    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[2] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        word TruthCp = Vec_WrdEntry( p->vPerm6, iClassC * 720 + PermC );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        if ( p->uComplMask[2] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[2] >> i) & 1 )
                    TruthCp = Abc_Tt6Flip( TruthCp, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        tC = (fComplC ^ pCutC->fCompl ^ Abc_LitIsCompl(pCutC->iFunc)) ? ~TruthCp : TruthCp;
        t = (tC & t1) | (~tC & t0);
    }

    // find configuration
    Config = Mpm_CutCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return 0;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // check if the gate exists
    if ( p->pPars->fMap4Gates )
    {
        if ( Vec_IntSize(Vec_WecEntry(p->vNpnConfigs, iClass)) == 0 )
        {
            p->nNoMatch++;
            return 0;
        }
    }

    // set the function
    pCut->iFunc = Abc_Var2Lit( iClass, fCompl );

if ( fVerbose )
{
Mpm_CutPrint( pCut0 );
Mpm_CutPrint( pCut1 );
Mpm_CutPrint( pCut );
}

    // update cut
    assert( (Config >> 6) < 720 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut->pLeaves[i], (Config >> i) & 1 );
    pCut->nLeaves = p->pDsd6[iClass].nVars;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        assert( pLeavesNew[i] != -1 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pCut->pLeaves[i] = pLeavesNew[i];
    p->nCountDsd[iClass]++;
    p->nSmallSupp += (int)(pCut->nLeaves < 2);

if ( fVerbose )
{
printf( "Computed " );
Mpm_CutPrint( pCut );
printf( "\n" );
}
    return 1;
}